

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrMesh.cpp
# Opt level: O2

void __thiscall amrex::AmrMesh::checkInput(AmrMesh *this)

{
  ostringstream *poVar1;
  int iVar2;
  pointer pGVar3;
  pointer pIVar4;
  pointer pIVar5;
  uint uVar6;
  bool bVar7;
  int iVar8;
  ostream *poVar9;
  Print *pPVar10;
  ulong uVar11;
  uint uVar12;
  int i;
  int iVar13;
  int idim;
  int iVar14;
  long lVar15;
  long lVar16;
  Box *this_00;
  int i_1;
  long lVar17;
  long lVar18;
  Real RVar19;
  Print local_1b8;
  
  if ((this->super_AmrInfo).max_level < 0) {
    Error_host("checkInput: max_level not set");
  }
  for (iVar13 = 0; iVar13 < (this->super_AmrInfo).max_level; iVar13 = iVar13 + 1) {
    iVar8 = MaxRefRatio(this,iVar13);
    if (iVar8 < 2) {
      Error_host("Amr::checkInput: bad ref_ratios");
    }
  }
  pGVar3 = (this->geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
           super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
           super__Vector_impl_data._M_start;
  this_00 = &pGVar3->domain;
  bVar7 = Box::ok(this_00);
  if (!bVar7) {
    Error_host("level 0 domain bad or not set");
  }
  poVar1 = &local_1b8.ss;
  iVar13 = 0;
  for (lVar17 = 0; lVar17 != 0xc; lVar17 = lVar17 + 4) {
    iVar8 = *(int *)((long)((this->super_AmrInfo).blocking_factor.
                            super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                            super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                            _M_impl.super__Vector_impl_data._M_start)->vect + lVar17);
    if (iVar8 <= *(int *)((long)((this->super_AmrInfo).max_grid_size.
                                 super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                                 super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->vect + lVar17)) {
      iVar14 = (*(int *)((long)&(pGVar3->domain).bigend + lVar17) -
               *(int *)((long)(this_00->smallend).vect + lVar17)) + 1;
      if (iVar14 % iVar8 != 0) {
        poVar9 = OutStream();
        Print::Print(&local_1b8,poVar9);
        std::operator<<((ostream *)poVar1,"domain size in direction ");
        std::ostream::operator<<(poVar1,iVar13);
        std::operator<<((ostream *)poVar1," is ");
        std::ostream::operator<<(poVar1,iVar14);
        std::endl<char,std::char_traits<char>>((ostream *)poVar1);
        Print::~Print(&local_1b8);
        poVar9 = OutStream();
        Print::Print(&local_1b8,poVar9);
        std::operator<<((ostream *)&local_1b8.ss,"blocking_factor is ");
        pPVar10 = Print::operator<<(&local_1b8,
                                    (int *)((long)((this->super_AmrInfo).blocking_factor.
                                                                                                      
                                                  super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>
                                                  .
                                                  super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->vect +
                                           lVar17));
        std::endl<char,std::char_traits<char>>((ostream *)&pPVar10->ss);
        Print::~Print(&local_1b8);
        Error_host("domain size not divisible by blocking_factor");
      }
    }
    iVar13 = iVar13 + 1;
  }
  for (lVar17 = 0; uVar11 = (ulong)(this->super_AmrInfo).max_level, lVar17 <= (long)uVar11;
      lVar17 = lVar17 + 1) {
    for (lVar15 = 0; lVar15 != 3; lVar15 = lVar15 + 1) {
      uVar6 = (this->super_AmrInfo).blocking_factor.
              super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
              super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
              super__Vector_impl_data._M_start[lVar17].vect[lVar15];
      do {
        uVar12 = uVar6;
        if ((int)uVar12 < 1) break;
        uVar6 = uVar12 >> 1;
      } while ((uVar12 & 1) == 0);
      if (uVar12 != 1) {
        Error_host(
                  "Amr::checkInput: blocking_factor not power of 2. You can bypass this by setting ParmParse runtime parameter amr.check_input=0, although we do not recommend it."
                  );
      }
    }
  }
  poVar1 = &local_1b8.ss;
  lVar17 = 0;
  do {
    pIVar4 = (this->super_AmrInfo).ref_ratio.
             super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
             super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
             super__Vector_impl_data._M_start;
    pIVar5 = (this->super_AmrInfo).blocking_factor.
             super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
             super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar15 = lVar17 * 0xc;
    do {
      lVar18 = lVar15;
      lVar16 = lVar17;
      if ((int)uVar11 <= lVar16) {
        poVar1 = &local_1b8.ss;
        lVar15 = 0;
        for (lVar17 = 0; lVar17 < (int)uVar11; lVar17 = lVar17 + 1) {
          iVar13 = 0;
          lVar16 = 3;
          lVar18 = lVar15;
          while (bVar7 = lVar16 != 0, lVar16 = lVar16 + -1, bVar7) {
            iVar8 = *(int *)((long)((this->super_AmrInfo).blocking_factor.
                                    super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                                    super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->vect + lVar18);
            iVar14 = *(int *)((long)((this->super_AmrInfo).max_grid_size.
                                     super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                                     super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->vect + lVar18);
            if ((iVar8 <= iVar14) && (iVar14 % iVar8 != 0)) {
              poVar9 = OutStream();
              Print::Print(&local_1b8,poVar9);
              std::operator<<((ostream *)poVar1,"max_grid_size in direction ");
              std::ostream::operator<<(poVar1,iVar13);
              std::operator<<((ostream *)poVar1," is ");
              pPVar10 = Print::operator<<(&local_1b8,
                                          (int *)((long)((this->super_AmrInfo).max_grid_size.
                                                                                                                  
                                                  super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>
                                                  .
                                                  super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->vect +
                                                 lVar18));
              std::endl<char,std::char_traits<char>>((ostream *)&pPVar10->ss);
              Print::~Print(&local_1b8);
              poVar9 = OutStream();
              Print::Print(&local_1b8,poVar9);
              std::operator<<((ostream *)&local_1b8.ss,"blocking_factor is ");
              pPVar10 = Print::operator<<(&local_1b8,
                                          (int *)((long)((this->super_AmrInfo).blocking_factor.
                                                                                                                  
                                                  super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>
                                                  .
                                                  super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->vect +
                                                 lVar18));
              std::endl<char,std::char_traits<char>>((ostream *)&pPVar10->ss);
              Print::~Print(&local_1b8);
              Error_host("max_grid_size not divisible by blocking_factor");
            }
            lVar18 = lVar18 + 4;
            iVar13 = iVar13 + 1;
          }
          uVar11 = (ulong)(uint)(this->super_AmrInfo).max_level;
          lVar15 = lVar15 + 0xc;
        }
        lVar15 = 0;
        lVar17 = 0;
        while (lVar17 < (int)uVar11) {
          iVar13 = 0;
          for (lVar16 = 0; lVar16 != 0xc; lVar16 = lVar16 + 4) {
            pIVar4 = (this->super_AmrInfo).blocking_factor.
                     super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                     super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                     super__Vector_impl_data._M_start;
            iVar8 = *(int *)((long)pIVar4[1].vect + lVar15 + lVar16) /
                    *(int *)((long)((this->super_AmrInfo).ref_ratio.
                                    super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                                    super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->vect +
                            lVar16 + lVar15);
            if (iVar8 < 2) {
              iVar8 = 1;
            }
            iVar14 = *(int *)((long)pIVar4->vect + lVar16 + lVar15);
            iVar2 = *(int *)((long)((this->super_AmrInfo).max_grid_size.
                                    super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                                    super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->vect +
                            lVar16 + lVar15);
            if (iVar2 < iVar14) {
              iVar14 = iVar2;
            }
            if (iVar14 % iVar8 != 0) {
              poVar9 = OutStream();
              Print::Print(&local_1b8,poVar9);
              std::operator<<((ostream *)&local_1b8.ss,"On level ");
              std::ostream::operator<<(&local_1b8.ss,(int)lVar17);
              std::operator<<((ostream *)&local_1b8.ss," in direction ");
              std::ostream::operator<<(&local_1b8.ss,iVar13);
              std::operator<<((ostream *)&local_1b8.ss," max_grid_size is ");
              pPVar10 = Print::operator<<(&local_1b8,
                                          (int *)((long)((this->super_AmrInfo).max_grid_size.
                                                                                                                  
                                                  super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>
                                                  .
                                                  super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->vect +
                                                 lVar16 + lVar15));
              std::operator<<((ostream *)&pPVar10->ss," blocking factor is ");
              pPVar10 = Print::operator<<(pPVar10,(int *)((long)((this->super_AmrInfo).
                                                                 blocking_factor.
                                                                                                                                  
                                                  super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>
                                                  .
                                                  super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->vect +
                                                  lVar16 + lVar15));
              poVar1 = &pPVar10->ss;
              std::operator<<((ostream *)poVar1,"\n");
              std::operator<<((ostream *)poVar1,"On level ");
              std::ostream::operator<<(poVar1,(int)(lVar17 + 1));
              std::operator<<((ostream *)poVar1," in direction ");
              std::ostream::operator<<(poVar1,iVar13);
              std::operator<<((ostream *)poVar1," blocking_factor is ");
              pPVar10 = Print::operator<<(pPVar10,(int *)((long)(this->super_AmrInfo).
                                                                blocking_factor.
                                                                                                                                
                                                  super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>
                                                  .
                                                  super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[1].vect
                                                  + lVar16 + lVar15));
              std::endl<char,std::char_traits<char>>((ostream *)&pPVar10->ss);
              Print::~Print(&local_1b8);
              Error_host(
                        "Coarse level blocking factor not a multiple of fine level blocking factor divided by ref ratio"
                        );
            }
            iVar13 = iVar13 + 1;
          }
          lVar15 = lVar15 + 0xc;
          lVar17 = lVar17 + 1;
          uVar11 = (ulong)(uint)(this->super_AmrInfo).max_level;
        }
        RVar19 = RealBox::volume(&((this->geom).
                                   super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                                   super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->prob_domain);
        if (RVar19 <= 0.0) {
          Error_host("Amr::checkInput: bad physical problem size");
        }
        if (0 < (this->super_AmrInfo).verbose) {
          poVar9 = OutStream();
          Print::Print(&local_1b8,poVar9);
          std::operator<<((ostream *)&local_1b8.ss,"Successfully read inputs file ... ");
          std::operator<<((ostream *)&local_1b8.ss,'\n');
          Print::~Print(&local_1b8);
        }
        return;
      }
      if ((*(int *)((long)pIVar4->vect + lVar18) * *(int *)((long)pIVar5->vect + lVar18) <
           *(int *)((long)pIVar5[1].vect + lVar18)) ||
         (*(int *)((long)pIVar4->vect + lVar18 + 4) * *(int *)((long)pIVar5->vect + lVar18 + 4) <
          *(int *)((long)pIVar5[1].vect + lVar18 + 4U))) break;
      lVar17 = lVar16 + 1;
      lVar15 = lVar18 + 0xc;
    } while (*(int *)((long)pIVar5[1].vect + lVar18 + 8U) <=
             *(int *)((long)pIVar4->vect + lVar18 + 8) * *(int *)((long)pIVar5->vect + lVar18 + 8));
    poVar9 = OutStream();
    Print::Print(&local_1b8,poVar9);
    std::operator<<((ostream *)poVar1,"Blocking factors on levels ");
    std::ostream::operator<<(poVar1,(int)lVar16);
    std::operator<<((ostream *)poVar1," and ");
    std::ostream::operator<<(poVar1,(int)lVar16 + 1);
    std::operator<<((ostream *)poVar1," are ");
    amrex::operator<<((ostream *)poVar1,
                      (IntVect *)
                      ((long)((this->super_AmrInfo).blocking_factor.
                              super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                              super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                              _M_impl.super__Vector_impl_data._M_start)->vect + lVar18));
    std::operator<<((ostream *)poVar1," ");
    amrex::operator<<((ostream *)poVar1,
                      (IntVect *)
                      ((long)(this->super_AmrInfo).blocking_factor.
                             super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                             super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                             _M_impl.super__Vector_impl_data._M_start[1].vect + lVar18));
    std::operator<<((ostream *)poVar1,". Ref ratio is ");
    amrex::operator<<((ostream *)poVar1,
                      (IntVect *)
                      ((long)((this->super_AmrInfo).ref_ratio.
                              super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                              super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                              _M_impl.super__Vector_impl_data._M_start)->vect + lVar18));
    std::operator<<((ostream *)poVar1,".  They vary too much between levels.");
    std::endl<char,std::char_traits<char>>((ostream *)poVar1);
    lVar17 = lVar16 + 1;
    Print::~Print(&local_1b8);
    Error_host("Blocking factors vary too much between levels");
    uVar11 = (ulong)(uint)(this->super_AmrInfo).max_level;
  } while( true );
}

Assistant:

void
AmrMesh::checkInput ()
{
    if (max_level < 0)
        amrex::Error("checkInput: max_level not set");

    //
    // Check level dependent values.
    //
    for (int i = 0; i < max_level; i++)
    {
        if (MaxRefRatio(i) < 2)
            amrex::Error("Amr::checkInput: bad ref_ratios");
    }

    const Box& domain = Geom(0).Domain();
    if (!domain.ok())
        amrex::Error("level 0 domain bad or not set");

    //
    // Check that domain size is a multiple of blocking_factor[0].
    //   (only check if blocking_factor <= max_grid_size)
    //
    for (int idim = 0; idim < AMREX_SPACEDIM; idim++)
    {
        int len = domain.length(idim);
        if (blocking_factor[0][idim] <= max_grid_size[0][idim])
           if (len%blocking_factor[0][idim] != 0)
           {
              amrex::Print() << "domain size in direction " << idim << " is " << len << std::endl;
              amrex::Print() << "blocking_factor is " << blocking_factor[0][idim] << std::endl;
              amrex::Error("domain size not divisible by blocking_factor");
           }
    }

    //
    // Check that blocking_factor is a power of 2.
    //
    for (int i = 0; i <= max_level; i++)
    {
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
        {
            int k = blocking_factor[i][idim];
            while ( k > 0 && (k%2 == 0) )
                k /= 2;
            if (k != 1)
                amrex::Error("Amr::checkInput: blocking_factor not power of 2. You can bypass this by setting ParmParse runtime parameter amr.check_input=0, although we do not recommend it.");
        }
    }

    //
    // Check that blocking_factor does not vary too much between levels
    //
    for (int i = 0; i < max_level; i++) {
        const IntVect bfrr = blocking_factor[i] * ref_ratio[i];
        if (!bfrr.allGE(blocking_factor[i+1])) {
            amrex::Print() << "Blocking factors on levels " << i << " and " << i+1
                           << " are " << blocking_factor[i] << " " << blocking_factor[i+1]
                           << ". Ref ratio is " << ref_ratio[i]
                           << ".  They vary too much between levels." << std::endl;
            amrex::Error("Blocking factors vary too much between levels");
        }
    }

    //
    // Check that max_grid_size is a multiple of blocking_factor at every level.
    //   (only check if blocking_factor <= max_grid_size)
    //
    for (int i = 0; i < max_level; i++)
    {
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
           if (blocking_factor[i][idim] <= max_grid_size[i][idim])
              if (max_grid_size[i][idim]%blocking_factor[i][idim] != 0) {
              {
                 amrex::Print() << "max_grid_size in direction " << idim
                                << " is " << max_grid_size[i][idim] << std::endl;
                 amrex::Print() << "blocking_factor is " << blocking_factor[i][idim] << std::endl;
                 amrex::Error("max_grid_size not divisible by blocking_factor");
              }
            }
        }
    }

    // Make sure TagBoxArray has no overlapped valid cells after coarsening by block_factor/ref_ratio
    for (int i = 0; i < max_level; ++i) {
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
            int bf_lev = std::max(1,blocking_factor[i+1][idim]/ref_ratio[i][idim]);
            int min_grid_size = std::min(blocking_factor[i][idim],max_grid_size[i][idim]);
            if (min_grid_size % bf_lev != 0) {
                amrex::Print() << "On level " << i << " in direction " << idim
                               << " max_grid_size is " << max_grid_size[i][idim]
                               << " blocking factor is " << blocking_factor[i][idim] << "\n"
                               << "On level " << i+1 << " in direction " << idim
                               << " blocking_factor is " << blocking_factor[i+1][idim] << std::endl;
                amrex::Error("Coarse level blocking factor not a multiple of fine level blocking factor divided by ref ratio");
            }
        }
    }

    if( ! (Geom(0).ProbDomain().volume() > 0.0) ) {
        amrex::Error("Amr::checkInput: bad physical problem size");
    }

    if(verbose > 0) {
        amrex::Print() << "Successfully read inputs file ... " << '\n';
    }
}